

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterList.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
bhf::ParameterList::Get<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,ParameterList *this,string *key,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *defaultValue)

{
  const_iterator cVar1;
  runtime_error *this_00;
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption>_>_>
                  *)this,key);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->map)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string(local_70,(string *)defaultValue);
    bhf::StringTo<std::__cxx11::string>(__return_storage_ptr__,cVar1._M_node + 3,local_70);
    std::__cxx11::string::~string(local_70);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"invalid parameter ",key);
  std::runtime_error::runtime_error(this_00,(string *)&local_50);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T Get(const std::string& key, const T defaultValue = {}) const
    {
        auto it = map.find(key);
        if (it == map.end()) {
            throw std::runtime_error("invalid parameter " + key);
        }
        return StringTo<T>(it->second.value, defaultValue);
    }